

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O0

void solve_linear_3x3_system(float *A,float *b,float *ret_x)

{
  undefined1 auVar1 [16];
  undefined8 in_RDX;
  long in_RSI;
  long in_RDI;
  int local_58;
  int local_54;
  int local_50;
  int local_4c;
  float afStack_48 [2];
  int j_1;
  int i_2;
  int j;
  int i_1;
  float A_inv [9];
  float det_inv;
  int i;
  float det;
  
  A_inv[5] = 0.0;
  for (A_inv[4] = 0.0; (int)A_inv[4] < 3; A_inv[4] = (float)((int)A_inv[4] + 1)) {
    auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + (long)(((int)A_inv[4] + 2) % 3 + 6) * 4)),
                             ZEXT416(*(uint *)(in_RDI + (long)(((int)A_inv[4] + 1) % 3 + 3) * 4)),
                             ZEXT416((uint)-(*(float *)(in_RDI + (long)(((int)A_inv[4] + 2) % 3 + 3)
                                                                 * 4) *
                                            *(float *)(in_RDI + (long)(((int)A_inv[4] + 1) % 3 + 6)
                                                                * 4))));
    auVar1 = vfmadd213ss_fma(auVar1,ZEXT416(*(uint *)(in_RDI + (long)(int)A_inv[4] * 4)),
                             ZEXT416((uint)A_inv[5]));
    A_inv[5] = auVar1._0_4_;
  }
  A_inv[3] = 1.0 / A_inv[5];
  A_inv._24_8_ = in_RDX;
  unique0x10000109 = in_RSI;
  for (local_4c = 0; local_4c < 3; local_4c = local_4c + 1) {
    for (local_50 = 0; local_50 < 3; local_50 = local_50 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(in_RDI + (long)(((local_50 + 2) % 3) * 3 +
                                                                (local_4c + 2) % 3) * 4)),
                               ZEXT416(*(uint *)(in_RDI + (long)(((local_50 + 1) % 3) * 3 +
                                                                (local_4c + 1) % 3) * 4)),
                               ZEXT416((uint)-(*(float *)(in_RDI + (long)(((local_50 + 1) % 3) * 3 +
                                                                         (local_4c + 2) % 3) * 4) *
                                              *(float *)(in_RDI + (long)(((local_50 + 2) % 3) * 3 +
                                                                        (local_4c + 1) % 3) * 4))));
      afStack_48[local_4c * 3 + local_50] = A_inv[3] * auVar1._0_4_;
    }
  }
  *(undefined4 *)A_inv._24_8_ = 0;
  *(undefined4 *)(A_inv._24_8_ + 4) = 0;
  *(undefined4 *)(A_inv._24_8_ + 8) = 0;
  for (local_54 = 0; local_54 < 3; local_54 = local_54 + 1) {
    for (local_58 = 0; local_58 < 3; local_58 = local_58 + 1) {
      auVar1 = vfmadd213ss_fma(ZEXT416(*(uint *)(stack0xfffffffffffffff0 + (long)local_58 * 4)),
                               ZEXT416((uint)afStack_48[local_54 * 3 + local_58]),
                               ZEXT416(*(uint *)(A_inv._24_8_ + (long)local_54 * 4)));
      *(int *)(A_inv._24_8_ + (long)local_54 * 4) = auVar1._0_4_;
    }
  }
  return;
}

Assistant:

void solve_linear_3x3_system(float A[9], float b[3], float ret_x[3]) {

    assert((A != NULL) && (b != NULL) && (ret_x != NULL));

    // computing determinant and inverse determinant of A
    float det = 0.0f;
    for (int i = 0; i < 3; ++i) {
       det += A[0*3 + i] * (A[1*3 + (i+1)%3] * A[2*3 + (i+2)%3] - A[1*3 + (i+2)%3] * A[2*3 + (i+1)%3]);
    }
    float det_inv = 1.0f / det;

    // computing inverse of 3x3 matrix A with inverse determinant
    float A_inv[9];
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            A_inv[i*3 + j] = det_inv * ((A[((j+1)%3)*3 + (i+1)%3] * A[((j+2)%3)*3 + (i+2)%3]) - (A[((j+1)%3)*3 + (i+2)%3] * A[((j+2)%3)*3 + (i+1)%3]));
        }
    }

    // computing solution vector x = A_inv * b
    ret_x[0] = 0.0f;
    ret_x[1] = 0.0f;
    ret_x[2] = 0.0f;
    for (int i = 0; i < 3; ++i) {
        for (int j = 0; j < 3; ++j) {
            ret_x[i] += A_inv[i*3 + j] * b[j];
        }
    }

}